

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_unusedcode.c
# Opt level: O0

int raviX_remove_unreachable_blocks(LinearizerState *linearizer)

{
  int iVar1;
  undefined1 local_38 [8];
  PtrListIterator prociter__;
  Proc *proc;
  LinearizerState *linearizer_local;
  
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_38,(PtrList *)linearizer->all_procs);
  prociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_38);
  while( true ) {
    if (prociter__._16_8_ == 0) {
      return 0;
    }
    iVar1 = process_proc(linearizer,(Proc *)prociter__._16_8_);
    if (iVar1 != 0) break;
    prociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_38);
  }
  return 1;
}

Assistant:

int raviX_remove_unreachable_blocks(LinearizerState *linearizer)
{
	Proc *proc;
	FOR_EACH_PTR(linearizer->all_procs, Proc, proc)
		{
			if (process_proc(linearizer, proc) != 0)
				return 1;
		}
	END_FOR_EACH_PTR(proc)
	return 0;
}